

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall
SuffixTree::GeneralizedSuffixTree::CalculateNumLeavesNumLCA(GeneralizedSuffixTree *this,Node *node)

{
  bool bVar1;
  reference ppVar2;
  pair<const_unsigned_int,_SuffixTree::Edge> *edge_pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
  *__range1;
  Node *node_local;
  GeneralizedSuffixTree *this_local;
  
  __end1 = std::
           unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
           ::begin(&node->edges);
  edge_pair = (pair<const_unsigned_int,_SuffixTree::Edge> *)
              std::
              unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
              ::end(&node->edges);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                         *)&edge_pair);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
             operator*(&__end1);
    if ((ppVar2->second).length == 0) {
      node->num_leaves = node->num_leaves + 1;
    }
    else {
      CalculateNumLeavesNumLCA(this,(ppVar2->second).field_0.node);
      node->num_leaves = ((ppVar2->second).field_0.node)->num_leaves + node->num_leaves;
      node->num_lca = ((ppVar2->second).field_0.node)->num_lca + node->num_lca;
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::CalculateNumLeavesNumLCA (Node *node)
{
    for (const auto &edge_pair : node->edges)
        if (edge_pair.second.length)
        {
            CalculateNumLeavesNumLCA (edge_pair.second.node);
            node->num_leaves += edge_pair.second.node->num_leaves;
            node->num_lca += edge_pair.second.node->num_lca;
        }
        else
            ++node->num_leaves;
}